

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_strided_acc(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld,
                     void *alpha)

{
  long *plVar1;
  long lVar2;
  Integer *lo_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  Integer IVar6;
  ulong uVar7;
  long lVar8;
  void *src_ptr;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong icode;
  long ndim;
  int proc;
  uint local_4fc;
  Integer local_4f8;
  int local_4f0;
  int local_4ec;
  char *prem;
  Integer *blo;
  Integer *local_4d8;
  Integer *bhi;
  void *local_4c8;
  ulong local_4c0;
  Integer *local_4b8;
  long local_4b0;
  Integer plo [7];
  int stride_rem [14];
  int count [14];
  Integer ldrem [7];
  int stride_loc [14];
  Integer phi [7];
  _iterator_hdl it_hdl;
  
  local_4f0 = GA[g_a + 1000].elemsize;
  local_4fc = (uint)GA[g_a + 1000].ndim;
  iVar4 = GA[g_a + 1000].type;
  local_4f8 = g_a;
  local_4d8 = hi;
  local_4c8 = buf;
  pnga_nnodes();
  local_4b0 = (long)GA[g_a + 1000].p_handle;
  uVar3 = iVar4 - 0x3e9;
  local_4b8 = lo;
  if ((uVar3 < 7) && ((0x6fU >> (uVar3 & 0x1f) & 1) != 0)) {
    local_4ec = *(int *)(&DAT_001c3a08 + (ulong)uVar3 * 4);
  }
  else {
    pnga_error("nga_strided_acc: type not supported",(long)iVar4);
    local_4ec = -1;
  }
  uVar7 = (ulong)local_4fc;
  if (0 < (short)local_4fc) {
    icode = 0;
    do {
      if (skip[icode] < 1) {
        pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",icode);
      }
      icode = icode + 1;
    } while (uVar7 != icode);
  }
  lo_00 = local_4b8;
  local_4c0 = uVar7;
  gai_iterator_init(local_4f8,local_4b8,local_4d8,&it_hdl);
  iVar4 = gai_iterator_next(&it_hdl,&proc,&blo,&bhi,&prem,ldrem);
  uVar3 = local_4fc;
  if (iVar4 != 0) {
    local_4f8 = (Integer)local_4f0;
    ndim = (long)(int)local_4fc;
    local_4c0 = local_4c0 << 3;
    uVar9 = local_4fc;
    do {
      uVar7 = local_4c0;
      if ((short)uVar9 < 1) {
        IVar6 = gai_correct_strided_patch(ndim,lo_00,skip,plo,phi);
        if (IVar6 != 0) {
          lVar12 = 0;
          goto LAB_00183434;
        }
      }
      else {
        local_4d8 = bhi;
        memcpy(plo,blo,local_4c0);
        uVar9 = local_4fc;
        memcpy(phi,local_4d8,uVar7);
        IVar6 = gai_correct_strided_patch(ndim,lo_00,skip,plo,phi);
        if (IVar6 != 0) {
          lVar12 = 0;
          lVar8 = 0;
          lVar13 = 1;
          do {
            lVar10 = lVar13;
            if (lVar8 < ndim + -1) {
              lVar10 = ldrem[lVar8] * lVar13;
            }
            lVar12 = lVar12 + (plo[lVar8] - blo[lVar8]) * lVar13;
            lVar8 = lVar8 + 1;
            lVar13 = lVar10;
          } while (ndim != lVar8);
LAB_00183434:
          prem = prem + lVar12 * local_4f8;
          lVar12 = (plo[0] - *lo_00) / *skip;
          if (1 < (short)uVar3) {
            lVar13 = 0;
            do {
              lVar2 = lVar13 + 1;
              lVar8 = lVar13 + 1;
              lVar10 = lVar13 + 1;
              plVar1 = ld + lVar13;
              lVar13 = lVar13 + 1;
              lVar12 = lVar12 + ((plo[lVar2] - lo_00[lVar8]) / skip[lVar10]) * *plVar1;
            } while (ndim + -1 != lVar13);
          }
          count[0] = 1;
          iVar4 = (int)local_4f8;
          if ((short)uVar9 < 1) {
            src_ptr = (void *)(lVar12 * local_4f8 + (long)local_4c8);
            lVar13 = 0;
            stride_rem[0] = iVar4;
            count[0] = iVar4;
            stride_loc[0] = iVar4;
          }
          else {
            lVar13 = 0;
            do {
              uVar7 = phi[lVar13] - plo[lVar13];
              if ((long)uVar7 < 0) goto LAB_001835bc;
              if (1 < skip[lVar13]) {
                uVar7 = uVar7 / (ulong)skip[lVar13];
              }
              count[lVar13 + 1] = (int)uVar7 + 1;
              lVar13 = lVar13 + 1;
            } while (ndim != lVar13);
            src_ptr = (void *)(lVar12 * local_4f8 + (long)local_4c8);
            count[0] = iVar4;
            stride_loc[0] = iVar4;
            stride_rem[0] = iVar4;
            if (0 < (short)uVar9) {
              lVar12 = 0;
              iVar4 = local_4f0;
              iVar5 = local_4f0;
              do {
                iVar11 = (int)skip[lVar12] * iVar4;
                iVar4 = iVar4 * (int)ldrem[lVar12];
                stride_rem[lVar12] = iVar11;
                stride_rem[lVar12 + 1] = iVar4;
                iVar5 = iVar5 * (int)ld[lVar12];
                stride_loc[lVar12 + 1] = iVar5;
                lVar12 = lVar12 + 1;
              } while (ndim != lVar12);
            }
          }
          if ((int)local_4b0 != -1) {
            proc = PGRP_LIST[local_4b0].inv_map_proc_list[proc];
          }
          ARMCI_AccS(local_4ec,alpha,src_ptr,stride_loc,prem,stride_rem,count,(int)lVar13,proc);
        }
      }
LAB_001835bc:
      iVar4 = gai_iterator_next(&it_hdl,&proc,&blo,&bhi,&prem,ldrem);
    } while (iVar4 != 0);
  }
  gai_iterator_destroy(&it_hdl);
  return;
}

Assistant:

void pnga_strided_acc(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                      void *buf, Integer *ld, void *alpha)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer
     alpha:  muliplicative scale factor */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, type, p_handle, nproc;
  int i, optype=-1, proc, ndim;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  type = GA[handle].type;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  if (type == C_DBL) optype = ARMCI_ACC_DBL;
  else if (type == C_FLOAT) optype = ARMCI_ACC_FLT;
  else if (type == C_DCPL) optype = ARMCI_ACC_DCP;
  else if (type == C_SCPL) optype = ARMCI_ACC_CPL;
  else if (type == C_INT) optype = ARMCI_ACC_INT;
  else if (type == C_LONG) optype = ARMCI_ACC_LNG;
  else pnga_error("nga_strided_acc: type not supported",type);

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, count,
          nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}